

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizard::restart(QWizard *this)

{
  QWizardPrivate *in_RDI;
  QWizardPrivate *d;
  Direction in_stack_00000028;
  int in_stack_0000002c;
  QWizardPrivate *in_stack_00000030;
  QWizardPrivate *this_00;
  
  this_00 = in_RDI;
  d_func((QWizard *)0x7bad8c);
  QWizardPrivate::disableUpdates(in_RDI);
  QWizardPrivate::reset(this_00);
  startId((QWizard *)in_RDI);
  QWizardPrivate::switchToPage(in_stack_00000030,in_stack_0000002c,in_stack_00000028);
  QWizardPrivate::enableUpdates(in_RDI);
  return;
}

Assistant:

void QWizard::restart()
{
    Q_D(QWizard);
    d->disableUpdates();
    d->reset();
    d->switchToPage(startId(), QWizardPrivate::Forward);
    d->enableUpdates();
}